

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O2

char * __thiscall
htmlcxx2::HTML::ParserSax::skipComment<char_const*>(ParserSax *this,char *pos,char *end)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)(pos + 2);
  do {
    if (pos == end) {
      return end;
    }
    pcVar1 = pos + 1;
    if ((pcVar1 != end && *pos == '-') && (pbVar4 = pbVar5, *pcVar1 == '-')) {
      do {
        if (pbVar4 == (byte *)end) {
          return end;
        }
        bVar2 = *pbVar4;
        iVar3 = isspace((uint)bVar2);
        pbVar4 = pbVar4 + 1;
      } while (iVar3 != 0);
      if (bVar2 == 0x3e) {
        return (char *)pbVar4;
      }
    }
    pbVar5 = pbVar5 + 1;
    pos = pcVar1;
  } while( true );
}

Assistant:

It ParserSax::skipComment(It pos, It end)
{
    while (pos != end)
    {
        if (*pos++ == '-' && pos != end && *pos == '-')
        {
            It d(pos);
            while (++pos != end && ::isspace((unsigned char)*pos))
                ;
            if (pos == end || *pos++ == '>')
                break;
            pos = d;
        }
    }
    return pos;
}